

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<unsigned_long_const&> *this,int *rhs)

{
  int iVar1;
  Catch *this_00;
  undefined4 uVar2;
  unsigned_long in_RDX;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  string local_1b8;
  undefined1 *local_198 [2];
  undefined1 local_188 [96];
  ios_base local_128 [264];
  
  this_00 = (Catch *)**(undefined8 **)(this + 0x228);
  uVar2 = 0x11;
  if (this_00 == (Catch *)(ulong)(uint)*rhs) {
    uVar2 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar2;
  toString_abi_cxx11_(&local_1b8,this_00,in_RDX);
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  iVar1 = *rhs;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,iVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"==","");
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  if (local_198[0] != local_188) {
    operator_delete(local_198[0]);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }